

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::ActualConfigure(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmState *pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  cmGlobalGenerator *pcVar8;
  string fullName;
  string local_90;
  string local_70;
  string local_50;
  
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  if (this->CurrentWorkingMode == NORMAL_MODE) {
    iVar4 = DoPreConfigureChecks(this);
    if (-1 < iVar4) {
      if (iVar4 == 0) goto LAB_0027c95b;
      goto LAB_0027c9e5;
    }
LAB_0027d087:
    iVar4 = -2;
  }
  else {
LAB_0027c95b:
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_HOME_DIRECTORY","");
    pcVar5 = cmState::GetSourceDirectory(this->State);
    cmState::AddCacheEntry
              (this->State,&local_90,pcVar5,
               "Source directory with the top level CMakeLists.txt file for this project",INTERNAL);
    UnwatchUnusedCli(this,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
LAB_0027c9e5:
    paVar1 = &local_90.field_2;
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      pcVar2 = this->State;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_GENERATOR","");
      pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = this->State;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"CMAKE_EXTRA_GENERATOR","");
      pcVar6 = cmState::GetInitializedCacheValue(pcVar2,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 != (char *)0x0) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        sVar7 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar5,pcVar5 + sVar7);
        pcVar5 = "";
        if (pcVar6 != (char *)0x0) {
          pcVar5 = pcVar6;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar7 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar5,pcVar5 + sVar7);
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_90,&local_70,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pcVar8 = CreateGlobalGenerator(this,&local_90);
        this->GlobalGenerator = pcVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
        cmSystemTools::s_ForceUnixPaths = this->GlobalGenerator->ForceUnixPaths;
        goto LAB_0027cb7c;
      }
      CreateDefaultGlobalGenerator(this);
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) goto LAB_0027cb7c;
      cmSystemTools::Error("Could not create generator",(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
LAB_0027cb7c:
      pcVar2 = this->State;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_GENERATOR","");
      pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 != (char *)0x0) {
        pcVar8 = this->GlobalGenerator;
        local_90._M_dataplus._M_p = (pointer)paVar1;
        sVar7 = strlen(pcVar5);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar5,pcVar5 + sVar7);
        iVar4 = (*pcVar8->_vptr_cmGlobalGenerator[4])(pcVar8,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((char)iVar4 != '\0') goto LAB_0027cc20;
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Error: generator : ","");
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_70);
        std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::append((char *)&local_90);
        std::__cxx11::string::append((char *)&local_90);
        cmSystemTools::Error(local_90._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0027d070:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0027d087;
      }
LAB_0027cc20:
      pcVar2 = this->State;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_GENERATOR","");
      pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 == (char *)0x0) {
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_GENERATOR","");
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_70);
        cmState::AddCacheEntry
                  (this->State,&local_90,local_70._M_dataplus._M_p,"Name of generator.",INTERNAL);
        UnwatchUnusedCli(this,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"CMAKE_EXTRA_GENERATOR","");
        cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_70,this->GlobalGenerator);
        cmState::AddCacheEntry
                  (this->State,&local_90,local_70._M_dataplus._M_p,
                   "Name of external makefile project generator.",INTERNAL);
        UnwatchUnusedCli(this,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar2 = this->State;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"CMAKE_GENERATOR_PLATFORM","");
      pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 == (char *)0x0) {
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"CMAKE_GENERATOR_PLATFORM","");
        cmState::AddCacheEntry
                  (this->State,&local_90,(this->GeneratorPlatform)._M_dataplus._M_p,
                   "Name of generator platform.",INTERNAL);
        UnwatchUnusedCli(this,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      else if ((this->GeneratorPlatform)._M_string_length == 0) {
        strlen(pcVar5);
        std::__cxx11::string::_M_replace
                  ((ulong)&this->GeneratorPlatform,0,(char *)0x0,(ulong)pcVar5);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&this->GeneratorPlatform);
        if (iVar4 != 0) {
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"Error: generator platform: ","");
          std::__cxx11::string::_M_append
                    ((char *)&local_90,(ulong)(this->GeneratorPlatform)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_90);
          std::__cxx11::string::append((char *)&local_90);
          std::__cxx11::string::append((char *)&local_90);
          cmSystemTools::Error(local_90._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          goto LAB_0027d070;
        }
      }
      pcVar2 = this->State;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"CMAKE_GENERATOR_TOOLSET","");
      pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 == (char *)0x0) {
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"CMAKE_GENERATOR_TOOLSET","");
        cmState::AddCacheEntry
                  (this->State,&local_90,(this->GeneratorToolset)._M_dataplus._M_p,
                   "Name of generator toolset.",INTERNAL);
        UnwatchUnusedCli(this,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      else if ((this->GeneratorToolset)._M_string_length == 0) {
        strlen(pcVar5);
        std::__cxx11::string::_M_replace((ulong)&this->GeneratorToolset,0,(char *)0x0,(ulong)pcVar5)
        ;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&this->GeneratorToolset);
        if (iVar4 != 0) {
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"Error: generator toolset: ","");
          std::__cxx11::string::_M_append
                    ((char *)&local_90,(ulong)(this->GeneratorToolset)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_90);
          std::__cxx11::string::append((char *)&local_90);
          std::__cxx11::string::append((char *)&local_90);
          cmSystemTools::Error(local_90._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          goto LAB_0027d070;
        }
      }
      bVar3 = cmState::GetIsInTryCompile(this->State);
      if (!bVar3) {
        cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
        TruncateOutputLog(this,"CMakeOutput.log");
        TruncateOutputLog(this,"CMakeError.log");
      }
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[9])();
      pcVar2 = this->State;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"CMAKE_BACKWARDS_COMPATIBILITY","");
      pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (pcVar5 != (char *)0x0) {
        pcVar2 = this->State;
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"LIBRARY_OUTPUT_PATH","");
        pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (pcVar5 == (char *)0x0) {
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"LIBRARY_OUTPUT_PATH","");
          cmState::AddCacheEntry
                    (this->State,&local_90,"","Single output directory for building all libraries.",
                     PATH);
          UnwatchUnusedCli(this,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar2 = this->State;
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"EXECUTABLE_OUTPUT_PATH","");
        pcVar5 = cmState::GetInitializedCacheValue(pcVar2,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (pcVar5 == (char *)0x0) {
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"EXECUTABLE_OUTPUT_PATH","");
          cmState::AddCacheEntry
                    (this->State,&local_90,"",
                     "Single output directory for building all executables.",PATH);
          UnwatchUnusedCli(this,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
      }
      this_00 = *(this->GlobalGenerator->Makefiles).
                 super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CTEST_USE_LAUNCHERS","");
      bVar3 = cmMakefile::IsOn(this_00,&local_90);
      if (bVar3) {
        pcVar2 = this->State;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"RULE_LAUNCH_COMPILE","");
        pcVar5 = cmState::GetGlobalProperty(pcVar2,&local_70);
        bVar3 = pcVar5 == (char *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        cmSystemTools::Error
                  ("CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                   ,(char *)0x0,(char *)0x0,(char *)0x0);
      }
      if (this->CurrentWorkingMode == NORMAL_MODE) {
        pcVar5 = cmState::GetBinaryDirectory(this->State);
        std::__cxx11::string::string((string *)&local_90,pcVar5,(allocator *)&local_70);
        SaveCache(this,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if (((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false)
          ) && (bVar3 = cmSystemTools::GetInterruptFlag(), !bVar3)) {
        return 0;
      }
    }
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = 0;
  if (this->GetWorkingMode() == NORMAL_MODE) {
    res = this->DoPreConfigureChecks();
  }
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    const char* genName =
      this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    const char* extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          genName, extraGenName ? extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  const char* genName =
    this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(genName)) {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += genName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR",
                        this->GlobalGenerator->GetName().c_str(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmStateEnums::INTERNAL);
  }

  if (const char* platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatform.empty()) {
      this->GeneratorPlatform = platformName;
    } else if (this->GeneratorPlatform != platformName) {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += platformName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                        this->GeneratorPlatform.c_str(),
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (const char* tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolset.empty()) {
      this->GeneratorToolset = tsName;
    } else if (this->GeneratorToolset != tsName) {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += tsName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                        this->GeneratorToolset.c_str(),
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  cmMakefile* mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  // only save the cache if there were no fatal errors
  if (this->GetWorkingMode() == NORMAL_MODE) {
    this->SaveCache(this->GetHomeOutputDirectory());
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  return 0;
}